

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSwapVariables(Abc_Ntk_t *pNtk)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Abc_Aig_t *pMan;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  int local_3c;
  int nVars;
  int i;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pMiter;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkPiNum(pNtk);
  iVar3 = Abc_NtkIsStrash(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0x126,"Abc_Ntk_t *Abc_NtkSwapVariables(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  for (local_3c = 0; local_3c < iVar2 / 2; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkPi(pNtk,local_3c);
    pAVar5 = Abc_NtkPi(pNtk,local_3c + iVar2 / 2);
    aVar1 = pAVar4->field_6;
    pAVar4->field_6 = pAVar5->field_6;
    pAVar5->field_6 = aVar1;
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_3c);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) {
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar5 = Abc_ObjChild0Copy(pAVar4);
      p1 = Abc_ObjChild1Copy(pAVar4);
      pAVar5 = Abc_AigAnd(pMan,pAVar5,p1);
      (pAVar4->field_6).pCopy = pAVar5;
    }
  }
  pAVar4 = Abc_NtkPo(pNtk,0);
  pAVar4 = Abc_ObjChild0Copy(pAVar4);
  pAVar5 = Abc_NtkPo(pNtk_00,0);
  Abc_ObjAddFanin(pAVar5,pAVar4);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkSwapVariables( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter, * pObj, * pObj0, * pObj1;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // update the PIs
    for ( i = 0; i < nVars; i++ )
    {
        pObj0 = Abc_NtkPi( pNtk, i );
        pObj1 = Abc_NtkPi( pNtk, i+nVars );
        pMiter = pObj0->pCopy;
        pObj0->pCopy = pObj1->pCopy;
        pObj1->pCopy = pMiter;
    }
    // restrash
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the PO
    pMiter = Abc_ObjChild0Copy( Abc_NtkPo(pNtk,0) );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}